

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

IdWithExprCoverageBinInitializerSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IdWithExprCoverageBinInitializerSyntax,slang::syntax::IdWithExprCoverageBinInitializerSyntax_const&>
          (BumpAllocator *this,IdWithExprCoverageBinInitializerSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  WithClauseSyntax *pWVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  IdWithExprCoverageBinInitializerSyntax *pIVar10;
  
  pIVar10 = (IdWithExprCoverageBinInitializerSyntax *)allocate(this,0x30,8);
  uVar5 = *(undefined4 *)&(args->super_CoverageBinInitializerSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_CoverageBinInitializerSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_CoverageBinInitializerSyntax).super_SyntaxNode.previewNode;
  TVar6 = (args->id).kind;
  uVar7 = (args->id).field_0x2;
  NVar8.raw = (args->id).numFlags.raw;
  uVar9 = (args->id).rawLen;
  pIVar3 = (args->id).info;
  pWVar4 = (args->withClause).ptr;
  (pIVar10->super_CoverageBinInitializerSyntax).super_SyntaxNode.kind =
       (args->super_CoverageBinInitializerSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar10->super_CoverageBinInitializerSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pIVar10->super_CoverageBinInitializerSyntax).super_SyntaxNode.parent = pSVar1;
  (pIVar10->super_CoverageBinInitializerSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pIVar10->id).kind = TVar6;
  (pIVar10->id).field_0x2 = uVar7;
  (pIVar10->id).numFlags = (NumericTokenFlags)NVar8.raw;
  (pIVar10->id).rawLen = uVar9;
  (pIVar10->id).info = pIVar3;
  (pIVar10->withClause).ptr = pWVar4;
  return pIVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }